

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::addImportLoggingSupport(TranslateToFuzzReader *this)

{
  char *pcVar1;
  Name root;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var2;
  mapped_type *pmVar3;
  Expression *pEVar4;
  pointer pTVar5;
  Signature SVar6;
  IString IVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 auStack_78 [8];
  Name baseName;
  key_type local_50;
  Type type;
  allocator<char> local_39;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_38;
  __single_object func;
  
  baseName.super_IString.str._M_str =
       (char *)(this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  type.id = (uintptr_t)this;
  for (pTVar5 = (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar5 != (pointer)baseName.super_IString.str._M_str; pTVar5 = pTVar5 + 1) {
    local_50.id = pTVar5->id;
    std::make_unique<wasm::Function>();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"log-",&local_39);
    wasm::Type::toString_abi_cxx11_();
    std::operator+(&local_98,&local_d8,&local_b8);
    IString::IString((IString *)auStack_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    root.super_IString.str._M_str = (char *)baseName.super_IString.str._M_len;
    root.super_IString.str._M_len = (size_t)auStack_78;
    IVar7.str = (string_view)Names::getValidFunctionName(*(Module **)type.id,root);
    _Var2._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         local_38._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(string_view *)
     local_38._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = IVar7.str;
    pmVar3 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->logImportNames,&local_50);
    pcVar1 = *(char **)((long)_Var2._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
    (pmVar3->super_IString).str._M_len =
         *(size_t *)
          _Var2._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    (pmVar3->super_IString).str._M_str = pcVar1;
    if (*(char *)(type.id + 0x4a) == '\0') {
      Name::Name((Name *)&local_98,"fuzzing-support");
      (((Name *)((long)local_38._M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x18))->
      super_IString).str._M_len = (size_t)local_98._M_dataplus._M_p;
      *(size_type *)
       ((long)local_38._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) =
           local_98._M_string_length;
      (((Name *)((long)local_38._M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x28))->
      super_IString).str._M_len = (size_t)auStack_78;
      *(size_t *)
       ((long)local_38._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x30) =
           baseName.super_IString.str._M_len;
    }
    else {
      pEVar4 = (Expression *)Builder::makeNop(&this->builder);
      *(Expression **)
       ((long)local_38._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x60) = pEVar4;
    }
    SVar6.results.id = 0;
    SVar6.params.id = local_50.id;
    wasm::HeapType::HeapType((HeapType *)&local_98,SVar6);
    ((HeapType *)
    ((long)local_38._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38))->id =
         (uintptr_t)local_98._M_dataplus._M_p;
    wasm::Module::addFunction(*(unique_ptr **)type.id);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_38);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addImportLoggingSupport() {
  for (auto type : loggableTypes) {
    auto func = std::make_unique<Function>();
    Name baseName = std::string("log-") + type.toString();
    func->name = Names::getValidFunctionName(wasm, baseName);
    logImportNames[type] = func->name;
    if (!preserveImportsAndExports) {
      func->module = "fuzzing-support";
      func->base = baseName;
    } else {
      // We cannot add an import, so just make it a trivial function (this is
      // simpler than avoiding calls to logging in all the rest of the logic).
      func->body = builder.makeNop();
    }
    func->type = Signature(type, Type::none);
    wasm.addFunction(std::move(func));
  }
}